

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_value<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  value_type *pvVar1;
  error_type *this;
  error_info *v;
  string *this_00;
  source_location src;
  result<toml::value_t,_toml::error_info> ty_res;
  allocator<char> local_3da;
  allocator<char> local_3d9;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  region local_358;
  source_location local_2f0;
  result<toml::value_t,_toml::error_info> local_278;
  source_location local_218;
  source_location local_1a0;
  error_info local_128;
  error_info local_d0;
  error_info local_78;
  
  guess_value_type<toml::type_config>(&local_278,loc,ctx);
  if (local_278.is_ok_ == false) {
    this = result<toml::value_t,_toml::error_info>::unwrap_err(&local_278,(source_location)0x46a0d0)
    ;
    err<toml::error_info_const&>((failure<toml::error_info> *)&local_128,(toml *)this,v);
    loc = (location *)&local_128;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_128);
    error_info::~error_info(&local_128);
    goto LAB_002f0090;
  }
  pvVar1 = result<toml::value_t,_toml::error_info>::unwrap(&local_278,(source_location)0x46a0e8);
  switch(*pvVar1) {
  case empty:
    if ((ctx->toml_spec_).ext_null_value == true) {
      parse_null<toml::type_config>(__return_storage_ptr__,loc,ctx);
      break;
    }
    region::region(&local_358,loc);
    source_location::source_location(&local_2f0,&local_358);
    region::~region(&local_358);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"toml::parse_value: unknown value appeared",&local_3d9);
    source_location::source_location(&local_1a0,&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"here",&local_3da);
    make_error_info<>((error_info *)&local_358,&local_378,&local_1a0,&local_398);
    err<toml::error_info>((failure<toml::error_info> *)&local_78,(error_info *)&local_358);
    loc = (location *)&local_78;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_78);
    error_info::~error_info(&local_78);
    error_info::~error_info((error_info *)&local_358);
    std::__cxx11::string::~string((string *)&local_398);
    source_location::~source_location(&local_1a0);
    this_00 = &local_378;
    goto LAB_002f0328;
  case boolean:
    parse_boolean<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case integer:
    parse_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case floating:
    parse_floating<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case string:
    parse_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case offset_datetime:
    parse_offset_datetime<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case local_datetime:
    parse_local_datetime<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case local_date:
    parse_local_date<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case local_time:
    parse_local_time<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case array:
    parse_array<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  case table:
    parse_inline_table<toml::type_config>(__return_storage_ptr__,loc,ctx);
    break;
  default:
    region::region(&local_358,loc);
    source_location::source_location(&local_2f0,&local_358);
    region::~region(&local_358);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"toml::parse_value: unknown value appeared",&local_3d9);
    source_location::source_location(&local_218,&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"here",&local_3da);
    make_error_info<>((error_info *)&local_358,&local_3b8,&local_218,&local_3d8);
    err<toml::error_info>((failure<toml::error_info> *)&local_d0,(error_info *)&local_358);
    loc = (location *)&local_d0;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_d0);
    error_info::~error_info(&local_d0);
    error_info::~error_info((error_info *)&local_358);
    std::__cxx11::string::~string((string *)&local_3d8);
    source_location::~source_location(&local_218);
    this_00 = &local_3b8;
LAB_002f0328:
    std::__cxx11::string::~string((string *)this_00);
    source_location::~source_location(&local_2f0);
  }
LAB_002f0090:
  result<toml::value_t,_toml::error_info>::cleanup(&local_278,(EVP_PKEY_CTX *)loc);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_value(location& loc, context<TC>& ctx)
{
    const auto ty_res = guess_value_type(loc, ctx);
    if(ty_res.is_err())
    {
        return err(ty_res.unwrap_err());
    }

    switch(ty_res.unwrap())
    {
        case value_t::empty:
        {
            if(ctx.toml_spec().ext_null_value)
            {
                return parse_null(loc, ctx);
            }
            else
            {
                auto src = source_location(region(loc));
                return err(make_error_info("toml::parse_value: unknown value appeared",
                            std::move(src), "here"));
            }
        }
        case value_t::boolean        : {return parse_boolean        (loc, ctx);}
        case value_t::integer        : {return parse_integer        (loc, ctx);}
        case value_t::floating       : {return parse_floating       (loc, ctx);}
        case value_t::string         : {return parse_string         (loc, ctx);}
        case value_t::offset_datetime: {return parse_offset_datetime(loc, ctx);}
        case value_t::local_datetime : {return parse_local_datetime (loc, ctx);}
        case value_t::local_date     : {return parse_local_date     (loc, ctx);}
        case value_t::local_time     : {return parse_local_time     (loc, ctx);}
        case value_t::array          : {return parse_array          (loc, ctx);}
        case value_t::table          : {return parse_inline_table   (loc, ctx);}
        default:
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_value: unknown value appeared",
                        std::move(src), "here"));
        }
    }
}